

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

void anon_unknown.dwarf_23886::output(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Pass *pPVar4;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  void *__buf;
  size_t __n;
  ulong uVar10;
  uint uVar11;
  undefined1 local_4f0 [4];
  uint res;
  undefined1 local_4d0 [8];
  string FN_1;
  string local_490;
  stringstream local_470 [8];
  stringstream ss_1;
  ostream local_460 [376];
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  string FN;
  stringstream local_268 [8];
  stringstream ss;
  ostream local_258 [380];
  int local_dc;
  string local_d8 [4];
  int fd;
  string func;
  string local_b0 [32];
  PassManager local_90 [8];
  PassManager Passes;
  raw_string_ostream local_70 [8];
  raw_string_ostream SS;
  undefined1 local_28 [8];
  string SStr;
  
  std::__cxx11::string::string((string *)local_28);
  llvm::raw_string_ostream::raw_string_ostream(local_70,(string *)local_28);
  llvm::legacy::PassManager::PassManager(local_90);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::RemoveUnusedArgs + 0x80));
  if (bVar1) {
    removeDeadArguments();
  }
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::Verify + 0x80));
  if (bVar1) {
    pPVar4 = (Pass *)llvm::createVerifierPass(true);
    llvm::legacy::PassManager::add(local_90,pPVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"",(allocator<char> *)(func.field_2._M_local_buf + 0xf));
  pPVar4 = (Pass *)llvm::createPrintModulePass((raw_ostream *)local_70,local_b0,false);
  llvm::legacy::PassManager::add(local_90,pPVar4);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(func.field_2._M_local_buf + 0xf));
  llvm::legacy::PassManager::run(local_90,(anonymous_namespace)::M);
  psVar5 = llvm::raw_string_ostream::str_abi_cxx11_(local_70);
  std::__cxx11::string::string(local_d8,(string *)psVar5);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::OneFuncPerFile + 0x80));
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_268);
    poVar6 = std::operator<<(local_258,(string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80)
                            );
    std::__cxx11::to_string((string *)((long)&FN.field_2 + 8),(anonymous_namespace)::Id);
    std::operator<<(poVar6,(string *)(FN.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(FN.field_2._M_local_buf + 8));
    uVar7 = std::__cxx11::string::find(local_d8,0x972668);
    pcVar9 = (char *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)local_d8,uVar7,pcVar9);
    std::__cxx11::to_string(&local_2e8,(anonymous_namespace)::Id);
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80),&local_2e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                   &local_2c8,".ll");
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    local_dc = open(pcVar9,0xc2,0x180);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::stringstream::~stringstream(local_268);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_470);
    poVar6 = std::operator<<(local_460,(string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80)
                            );
    std::__cxx11::to_string(&local_490,(anonymous_namespace)::Id);
    std::operator<<(poVar6,(string *)&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    uVar7 = std::__cxx11::string::find(local_d8,0x972668);
    psVar8 = (string *)std::__cxx11::string::length();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_d8,uVar7,psVar8);
    std::__cxx11::string::~string((string *)(FN_1.field_2._M_local_buf + 8));
    iVar2 = rand();
    iVar3 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::NumFiles + 0x80));
    std::__cxx11::to_string((string *)local_4f0,iVar2 % iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0,
                   ".ll");
    std::__cxx11::string::~string((string *)local_4f0);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    local_dc = open(pcVar9,0x442,0x180);
    std::__cxx11::string::~string((string *)local_4d0);
    std::__cxx11::stringstream::~stringstream(local_470);
  }
  if (local_dc < 2) {
    die("open failed");
  }
  iVar2 = local_dc;
  __buf = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::length();
  uVar7 = write(iVar2,__buf,__n);
  uVar10 = std::__cxx11::string::length();
  if ((uVar7 & 0xffffffff) != uVar10) {
    die("non-atomic write");
  }
  uVar11 = (uint)uVar10;
  iVar2 = close(local_dc);
  if (iVar2 != 0) {
    die("res == 0 failed at line __LINE__");
    llvm::llvm_unreachable_internal
              ((llvm *)"assert",
               "/workspace/llm4binary/github/license_c_cmakelists/regehr[P]opt-fuzz/opt-fuzz.cpp",
               (char *)0x3d1,uVar11);
  }
  std::__cxx11::string::~string(local_d8);
  llvm::legacy::PassManager::~PassManager(local_90);
  llvm::raw_string_ostream::~raw_string_ostream(local_70);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void output() {
  std::string SStr;
  raw_string_ostream SS(SStr);
  legacy::PassManager Passes;
  // Passes.add(createDeadCodeEliminationPass());
  if (RemoveUnusedArgs)
    removeDeadArguments();
  if (Verify)
    Passes.add(createVerifierPass());
  Passes.add(createPrintModulePass(SS));
  Passes.run(*M);

  std::string func = SS.str();

  int fd;
  if (OneFuncPerFile) {
    std::stringstream ss;
    ss << BaseName << std::to_string(Id);
    func.replace(func.find(BaseName), BaseName.length(), "f");
    std::string FN = BaseName + std::to_string(Id) + ".ll";
    fd = open(FN.c_str(), O_RDWR | O_CREAT | O_EXCL, S_IREAD | S_IWRITE);
  } else {
    std::stringstream ss;
    ss << BaseName << std::to_string(Id);
    func.replace(func.find(BaseName), BaseName.length(), ss.str());
    std::string FN = std::to_string(rand() % NumFiles) + ".ll";
    fd = open(FN.c_str(), O_RDWR | O_CREAT | O_APPEND, S_IREAD | S_IWRITE);
  }
  if (fd < 2)
    die("open failed");

  /*
   * hack -- instead of locking the file we're just going to count on
   * an atomic write and bail if it doesn't work -- this seems to work
   * fine on Linux and OS X
   */
  unsigned res = write(fd, func.c_str(), func.length());
  if (res != func.length())
    die("non-atomic write");
  res = close(fd);
  assert(res == 0);
}